

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sysbvm_stringSlice_equalsFunction(void *element,sysbvm_tuple_t setElement)

{
  _Bool _Var1;
  int iVar2;
  size_t __n;
  size_t setElementSize;
  sysbvm_stringSlice_t *stringSlice;
  sysbvm_tuple_t setElement_local;
  void *element_local;
  
  _Var1 = sysbvm_tuple_isBytes((long)(int)(uint)((setElement != 0 ^ 0xffU) & 1));
  if (_Var1) {
    element_local._7_1_ = false;
  }
  else {
    __n = sysbvm_tuple_getSizeInBytes(setElement);
    if (__n == *(size_t *)((long)element + 8)) {
      iVar2 = memcmp(*element,(void *)(setElement + 0x10),__n);
      element_local._7_1_ = iVar2 == 0;
    }
    else {
      element_local._7_1_ = false;
    }
  }
  return element_local._7_1_;
}

Assistant:

bool sysbvm_stringSlice_equalsFunction(void *element, sysbvm_tuple_t setElement)
{
    sysbvm_stringSlice_t *stringSlice = (sysbvm_stringSlice_t*)element;
    if(sysbvm_tuple_isBytes(!setElement))
        return false;

    size_t setElementSize = sysbvm_tuple_getSizeInBytes(setElement);
    if(setElementSize != stringSlice->size)
        return false;

    return memcmp(stringSlice->elements, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(setElement)->bytes, setElementSize) == 0;
}